

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

int __thiscall
QPDF::outputLengthNextN(QPDF *this,int in_object,int n,NewObjTable *new_obj,ObjTable *obj)

{
  int iVar1;
  long lVar2;
  Object *pOVar3;
  NewObject *pNVar4;
  long i;
  size_t idx;
  string local_58;
  QPDF *local_38;
  
  local_38 = this;
  pOVar3 = ObjTable<QPDFWriter::Object>::element
                     (&obj->super_ObjTable<QPDFWriter::Object>,(long)in_object);
  iVar1 = pOVar3->renumber;
  idx = (size_t)iVar1;
  if ((long)idx < 1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "found object that is not renumbered while writing linearization data","");
    stopOnError(local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (n < 1) {
    i = 0;
  }
  else {
    i = 0;
    do {
      pNVar4 = ObjTable<QPDFWriter::NewObject>::element
                         (&new_obj->super_ObjTable<QPDFWriter::NewObject>,idx);
      lVar2 = pNVar4->length;
      if (lVar2 == 0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "found item with unknown length while writing linearization data","");
        stopOnError(local_38,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      i = i + lVar2;
      idx = idx + 1;
    } while ((long)idx < (long)(n + iVar1));
    if ((int)i != i) {
      QIntC::IntConverter<long_long,_int,_true,_true>::error(i);
    }
  }
  return (int)i;
}

Assistant:

int
QPDF::outputLengthNextN(
    int in_object, int n, QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    // Figure out the length of a series of n consecutive objects in the output file starting with
    // whatever object in_object from the input file mapped to.

    int first = obj[in_object].renumber;
    int last = first + n;
    if (first <= 0) {
        stopOnError("found object that is not renumbered while writing linearization data");
    }
    qpdf_offset_t length = 0;
    for (int i = first; i < last; ++i) {
        auto l = new_obj[i].length;
        if (l == 0) {
            stopOnError("found item with unknown length while writing linearization data");
        }
        length += l;
    }
    return toI(length);
}